

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

ValueInfo * __thiscall
GlobOpt::UpdateIntBoundsForNotEqual
          (GlobOpt *this,Value *value,IntConstantBounds *constantBounds,Value *boundValue,
          IntConstantBounds *boundConstantBounds,bool isExplicit)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IntBounds *this_00;
  IntBoundedValueInfo *pIVar5;
  ValueInfo *pVVar6;
  int min;
  int max;
  bool isBoundConstant;
  
  if (value == (Value *)0x0) {
    if (constantBounds->lowerBound != constantBounds->upperBound) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x1d1,"(value || constantBounds.IsConstant())",
                         "value || constantBounds.IsConstant()");
      if (!bVar3) goto LAB_004a2309;
      *puVar4 = 0;
    }
    if (boundValue != (Value *)0x0) {
      return (ValueInfo *)0x0;
    }
LAB_004a20b2:
    if (boundConstantBounds->lowerBound != boundConstantBounds->upperBound) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x1d2,"(boundValue || boundConstantBounds.IsConstant())",
                         "boundValue || boundConstantBounds.IsConstant()");
      if (!bVar3) goto LAB_004a2309;
      *puVar4 = 0;
    }
    bVar3 = true;
    if (value == (Value *)0x0) {
      return (ValueInfo *)0x0;
    }
  }
  else {
    if (boundValue == (Value *)0x0) goto LAB_004a20b2;
    if (value->valueNumber == boundValue->valueNumber) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x1d7,
                         "(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber())",
                         "!boundValue || value->GetValueNumber() != boundValue->GetValueNumber()");
      if (!bVar3) goto LAB_004a2309;
      *puVar4 = 0;
      bVar3 = false;
    }
    else {
      bVar3 = false;
    }
  }
  pVVar6 = value->valueInfo;
  iVar1 = boundConstantBounds->lowerBound;
  isBoundConstant = iVar1 == boundConstantBounds->upperBound;
  this_00 = GetIntBoundsToUpdate
                      (this,pVVar6,constantBounds,false,isBoundConstant,
                       iVar1 == constantBounds->upperBound && isBoundConstant,isExplicit);
  if (this_00 != (IntBounds *)0x0) {
    if (bVar3) {
      bVar3 = IntBounds::SetIsNot(this_00,boundConstantBounds->lowerBound,isExplicit);
    }
    else {
      bVar3 = IntBounds::SetIsNot(this_00,boundValue,isExplicit);
    }
    if (bVar3 == false) {
      IntBounds::Delete(this_00);
      return (ValueInfo *)0x0;
    }
    bVar3 = IntBounds::RequiresIntBoundedValueInfo
                      (this_00,(ValueType)
                               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                &(pVVar6->super_ValueType).field_0.field_0);
    if (bVar3) {
      pIVar5 = NewIntBoundedValueInfo(this,pVVar6,this_00);
      return &pIVar5->super_ValueInfo;
    }
    IntBounds::Delete(this_00);
  }
  bVar3 = ValueType::IsInt(&pVVar6->super_ValueType);
  if ((bVar3) && (iVar1 = boundConstantBounds->lowerBound, iVar1 == boundConstantBounds->upperBound)
     ) {
    min = constantBounds->lowerBound;
    max = constantBounds->upperBound;
    if (iVar1 == min) {
      if (max < iVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x1ff,"(newMin <= newMax)","newMin <= newMax");
        if (!bVar3) {
LAB_004a2309:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      if (iVar1 != max) {
        min = iVar1 + 1;
LAB_004a22d9:
        pVVar6 = NewIntRangeValueInfo(this,pVVar6,min,max);
        return pVVar6;
      }
    }
    else if (iVar1 == max) {
      if (iVar1 < min) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x208,"(newMin <= newMax)","newMin <= newMax");
        if (!bVar3) goto LAB_004a2309;
        *puVar4 = 0;
      }
      max = iVar1 + -1;
      goto LAB_004a22d9;
    }
  }
  return (ValueInfo *)0x0;
}

Assistant:

ValueInfo *GlobOpt::UpdateIntBoundsForNotEqual(
    Value *const value,
    const IntConstantBounds &constantBounds,
    Value *const boundValue,
    const IntConstantBounds &boundConstantBounds,
    const bool isExplicit)
{
    Assert(value || constantBounds.IsConstant());
    Assert(boundValue || boundConstantBounds.IsConstant());
    if(!value)
    {
        return nullptr;
    }
    Assert(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber());

    ValueInfo *const valueInfo = value->GetValueInfo();
    IntBounds *const bounds =
        GetIntBoundsToUpdate(
            valueInfo,
            constantBounds,
            false,
            boundConstantBounds.IsConstant(),
            boundConstantBounds.IsConstant() && boundConstantBounds.LowerBound() == constantBounds.UpperBound(),
            isExplicit);
    if(bounds)
    {
        if(boundValue
                ? bounds->SetIsNot(boundValue, isExplicit)
                : bounds->SetIsNot(boundConstantBounds.LowerBound(), isExplicit))
        {
            if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
            {
                return NewIntBoundedValueInfo(valueInfo, bounds);
            }
        }
        else
        {
            bounds->Delete();
            return nullptr;
        }
        bounds->Delete();
    }

    if(!valueInfo->IsInt() || !boundConstantBounds.IsConstant())
    {
        return nullptr;
    }
    const int32 constantBound = boundConstantBounds.LowerBound();

    // The value is not equal to a constant, so narrow the range if the constant is equal to the value's lower or upper bound
    int32 newMin = constantBounds.LowerBound(), newMax = constantBounds.UpperBound();
    if(constantBound == newMin)
    {
        Assert(newMin <= newMax);
        if(newMin == newMax)
        {
            return nullptr;
        }
        ++newMin;
    }
    else if(constantBound == newMax)
    {
        Assert(newMin <= newMax);
        if(newMin == newMax)
        {
            return nullptr;
        }
        --newMax;
    }
    else
    {
        return nullptr;
    }
    return NewIntRangeValueInfo(valueInfo, newMin, newMax);
}